

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::handle
          (PhysicalStorageBufferPointerHandler *this,Op op,uint32_t *args,uint32_t length)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  mapped_type *ppPVar3;
  uint32_t *args_00;
  uint32_t length_00;
  uint32_t id;
  _Hash_node_base *p_Var4;
  
  uVar1 = (ulong)(op - OpStore);
  if (op - OpStore < 0x3f) {
    if ((0x200038UL >> (uVar1 & 0x3f) & 1) != 0) {
      p_Var4 = (_Hash_node_base *)0x0;
      p_Var2 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&(this->access_chain_to_physical_block)._M_h,
                          (ulong)args[2] %
                          (this->access_chain_to_physical_block)._M_h._M_bucket_count,args + 2,
                          (ulong)args[2]);
      if (p_Var2 != (__node_base_ptr)0x0) {
        p_Var4 = p_Var2->_M_nxt;
      }
      if (p_Var4 == (_Hash_node_base *)0x0) {
        return true;
      }
      p_Var4 = p_Var4[2]._M_nxt;
      ppPVar3 = ::std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->access_chain_to_physical_block,args + 1);
      *ppPVar3 = (mapped_type)p_Var4;
      return true;
    }
    if ((0x4400000000080000U >> (uVar1 & 0x3f) & 1) != 0) {
      setup_meta_chain(this,*args,args[1]);
      return true;
    }
    if (uVar1 == 0) {
      if (length < 3) {
        return true;
      }
      id = *args;
      args_00 = args + 2;
      length_00 = length - 2;
      goto LAB_007c98c4;
    }
  }
  if (op != OpLoad) {
    return true;
  }
  setup_meta_chain(this,*args,args[1]);
  if (length < 4) {
    return true;
  }
  id = args[2];
  args_00 = args + 3;
  length_00 = length - 3;
LAB_007c98c4:
  mark_aligned_access(this,id,args_00,length_00);
  return true;
}

Assistant:

bool Compiler::PhysicalStorageBufferPointerHandler::handle(Op op, const uint32_t *args, uint32_t length)
{
	// When a BDA pointer comes to life, we need to keep a mapping of SSA ID -> type ID for the pointer type.
	// For every load and store, we'll need to be able to look up the type ID being accessed and mark any alignment
	// requirements.
	switch (op)
	{
	case OpConvertUToPtr:
	case OpBitcast:
	case OpCompositeExtract:
		// Extract can begin a new chain if we had a struct or array of pointers as input.
		// We don't begin chains before we have a pure scalar pointer.
		setup_meta_chain(args[0], args[1]);
		break;

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpCopyObject:
	{
		auto itr = access_chain_to_physical_block.find(args[2]);
		if (itr != access_chain_to_physical_block.end())
			access_chain_to_physical_block[args[1]] = itr->second;
		break;
	}

	case OpLoad:
	{
		setup_meta_chain(args[0], args[1]);
		if (length >= 4)
			mark_aligned_access(args[2], args + 3, length - 3);
		break;
	}

	case OpStore:
	{
		if (length >= 3)
			mark_aligned_access(args[0], args + 2, length - 2);
		break;
	}

	default:
		break;
	}

	return true;
}